

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

void __thiscall CECorrections::init_members(CECorrections *this)

{
  long in_RDI;
  char *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  vector<double,_std::allocator<double>_> *__x;
  allocator_type *in_stack_fffffffffffffd70;
  string *this_00;
  size_type in_stack_fffffffffffffd78;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  string *this_01;
  vector<double,_std::allocator<double>_> local_1e9;
  undefined1 local_1c9 [32];
  allocator local_1a9;
  string local_1a8 [32];
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  string local_140 [247];
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  *(undefined1 *)(in_RDI + 0x128) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Jvinniec[P]CppEphem/build_O0/build/share/cppephem/"
             ,&local_49);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<int>::allocator((allocator<int> *)0x1502e4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78,(allocator_type *)in_stack_fffffffffffffd70);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd68);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
  std::allocator<int>::~allocator((allocator<int> *)0x15033a);
  std::allocator<double>::allocator((allocator<double> *)0x15034f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  std::allocator<double>::~allocator((allocator<double> *)0x15039f);
  std::allocator<double>::allocator((allocator<double> *)0x1503b4);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  std::allocator<double>::~allocator((allocator<double> *)0x150407);
  std::allocator<double>::allocator((allocator<double> *)0x150419);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  std::allocator<double>::~allocator((allocator<double> *)0x150469);
  std::allocator<double>::allocator((allocator<double> *)0x15047b);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  std::allocator<double>::~allocator((allocator<double> *)0x1504cb);
  std::allocator<double>::allocator((allocator<double> *)0x1504dd);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  std::allocator<double>::~allocator((allocator<double> *)0x15052d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Jvinniec[P]CppEphem/build_O0/build/share/cppephem/"
             ,&local_161);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  this_01 = local_140;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),this_01);
  std::__cxx11::string::~string(this_01);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Jvinniec[P]CppEphem/build_O0/build/share/cppephem/"
             ,&local_1a9);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  this_00 = local_188;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  __n = local_1c9;
  std::allocator<double>::allocator((allocator<double> *)0x150659);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,(size_type)__n,
             (allocator_type *)this_00);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)this_00,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x1506a9);
  __x = &local_1e9;
  std::allocator<double>::allocator((allocator<double> *)0x1506bb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,(size_type)__n,
             (allocator_type *)this_00);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)this_00,__x);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x150709);
  *(undefined8 *)(in_RDI + 0x130) = 0xc6293e5939a08cea;
  *(undefined8 *)(in_RDI + 0x138) = 0;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined8 *)(in_RDI + 0x158) = 0;
  *(undefined8 *)(in_RDI + 0x160) = 0xc6293e5939a08cea;
  *(undefined8 *)(in_RDI + 0x168) = 0x404fea0c49ba5e35;
  return;
}

Assistant:

void CECorrections::init_members(void)
{
    // Note that CECORRFILEPATH is defined at compile time
    interp_ = false;

    nutation_file_ = std::string(CECORRFILEPATH) + "/nutation.txt";
    nutation_mjd_  = std::vector<int>(0);
    nutation_dut1_ = std::vector<double>(0);
    nutation_xp_   = std::vector<double>(0);
    nutation_yp_   = std::vector<double>(0);
    nutation_deps_ = std::vector<double>(0);
    nutation_dpsi_ = std::vector<double>(0);

    ttut1_file_hist_ = std::string(CECORRFILEPATH) + "/ttut1_historic.txt";
    ttut1_file_pred_ = std::string(CECORRFILEPATH) + "/ttut1_predicted.txt";
    ttut1_mjd_       = std::vector<double>(0);
    ttut1_delt_      = std::vector<double>(0); 

    // Nutation cached values
    cache_nut_mjd_  = -1e30;
    cache_nut_dut1_ = 0.0;
    cache_nut_xp_   = 0.0;
    cache_nut_yp_   = 0.0;
    cache_nut_deps_ = 0.0;
    cache_nut_dpsi_ = 0.0;

    // TT-UT1 cached values
    cache_ttut1_mjd_  = -1e30;
    cache_ttut1_delt_ = 63.8285; // Default to J2000 reference date value
}